

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall MutableS2ShapeIndex::Iterator::Finish(Iterator *this)

{
  (this->iter_).position = (this->end_).position;
  (this->iter_).node = (this->end_).node;
  (this->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
  (this->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
  return;
}

Assistant:

bool operator==(const const_iterator &x) const {
    return node == x.node && position == x.position;
  }